

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::StringParameter::SerializeWithCachedSizes
          (StringParameter *this,CodedOutputStream *output)

{
  int size;
  long lVar1;
  char *data;
  string *value;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  StringParameter *this_local;
  
  defaultvalue_abi_cxx11_(this);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    defaultvalue_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    defaultvalue_abi_cxx11_(this);
    size = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (data,size,SERIALIZE,"CoreML.Specification.StringParameter.defaultValue");
    value = defaultvalue_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(1,value,output);
  }
  return;
}

Assistant:

void StringParameter::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.StringParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // string defaultValue = 1;
  if (this->defaultvalue().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->defaultvalue().data(), this->defaultvalue().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.StringParameter.defaultValue");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->defaultvalue(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.StringParameter)
}